

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_acceptance.c
# Opt level: O3

REF_STATUS ref_acceptance_u_lisbon(REF_DBL x,REF_DBL y,REF_DBL *scalar)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  auVar4._0_8_ = x * 1e+20;
  auVar4._8_8_ = y;
  auVar5._8_8_ = -y;
  auVar5._0_8_ = -auVar4._0_8_;
  auVar5 = maxpd(auVar4,auVar5);
  bVar1 = auVar5._0_8_ <= auVar5._8_8_;
  if (bVar1) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c",
           0xe3,"ref_acceptance_u_lisbon","lisbon not defined for x=0");
  }
  else {
    dVar3 = (y * 4.0) / x;
    dVar2 = erf(dVar3);
    dVar3 = exp(-dVar3 * dVar3);
    dVar3 = (1.0 - dVar3) * 0.14104739588693913;
    *scalar = SQRT(dVar2 * dVar2 + dVar3 * dVar3);
  }
  return (uint)bVar1;
}

Assistant:

REF_FCN static REF_STATUS ref_acceptance_u_lisbon(REF_DBL x, REF_DBL y,
                                                  REF_DBL *scalar) {
  REF_DBL sigma, nu, u, v;
  sigma = 4.0;
  RAS(ref_math_divisible(y, x), "lisbon not defined for x=0");
  nu = sigma * y / x;
  u = erf(nu);
  v = 1.0 / (sigma * sqrt(ref_math_pi)) * (1.0 - exp(-nu * nu));
  *scalar = sqrt(u * u + v * v);

  return REF_SUCCESS;
}